

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

bool __thiscall
FState::CallAction(FState *this,AActor *self,AActor *stateowner,FStateParamInfo *info,
                  FState **stateret)

{
  VMFunction *pVVar1;
  PPrototype *pPVar2;
  int iVar3;
  long lVar4;
  VMFunction *func;
  VMValue params [3];
  VMReturn ret;
  
  pVVar1 = this->ActionFunc;
  if (pVVar1 == (VMFunction *)0x0) goto LAB_00466efa;
  cycle_t::Clock(&ActionCycles);
  if (CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack == '\0') {
    iVar3 = __cxa_guard_acquire(&CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack);
    if (iVar3 != 0) {
      VMFrameStack::VMFrameStack(&CallAction::stack);
      __cxa_atexit(VMFrameStack::~VMFrameStack,&CallAction::stack,&__dso_handle);
      __cxa_guard_release(&CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack);
    }
  }
  params[0].field_0._8_4_ = 1;
  params[0].field_0.field_3.Type = '\x03';
  params[1].field_0.field_3.Type = '\x03';
  params[2].field_0.field_1.atag = 8;
  params[2].field_0.field_3.Type = '\x03';
  params[0].field_0._0_8_ = self;
  params[1].field_0._0_8_ = stateowner;
  params[1].field_0._8_4_ = params[0].field_0._8_4_;
  params[2].field_0._0_8_ = info;
  if (stateret == (FState **)0x0) {
    func = this->ActionFunc;
LAB_00466eb5:
    VMFrameStack::Call(&CallAction::stack,func,params,3,(VMReturn *)0x0,0,(VMException **)0x0);
  }
  else {
    *stateret = (FState *)0x0;
    func = this->ActionFunc;
    pPVar2 = func->Proto;
    if (((pPVar2 == (PPrototype *)0x0) || ((pPVar2->ReturnTypes).Count == 0)) ||
       (*(pPVar2->ReturnTypes).Array != (PType *)TypeState)) goto LAB_00466eb5;
    ret.TagOfs = 0;
    ret.RegType = '\x03';
    ret.Location = stateret;
    VMFrameStack::Call(&CallAction::stack,func,params,3,&ret,1,(VMException **)0x0);
  }
  cycle_t::Unclock(&ActionCycles);
  lVar4 = 0x20;
  do {
    VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar4));
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x10);
LAB_00466efa:
  return pVVar1 != (VMFunction *)0x0;
}

Assistant:

bool FState::CallAction(AActor *self, AActor *stateowner, FStateParamInfo *info, FState **stateret)
{
	if (ActionFunc != NULL)
	{
		ActionCycles.Clock();

		static VMFrameStack stack;
		VMValue params[3] = { self, stateowner, VMValue(info, ATAG_STATEINFO) };
		// If the function returns a state, store it at *stateret.
		// If it doesn't return a state but stateret is non-NULL, we need
		// to set *stateret to NULL.
		if (stateret != NULL)
		{
			*stateret = NULL;
			if (ActionFunc->Proto == NULL ||
				ActionFunc->Proto->ReturnTypes.Size() == 0 ||
				ActionFunc->Proto->ReturnTypes[0] != TypeState)
			{
				stateret = NULL;
			}
		}
		if (stateret == NULL)
		{
			stack.Call(ActionFunc, params, countof(params), NULL, 0, NULL);
		}
		else
		{
			VMReturn ret;
			ret.PointerAt((void **)stateret);
			stack.Call(ActionFunc, params, countof(params), &ret, 1, NULL);
		}
		ActionCycles.Unclock();
		return true;
	}
	else
	{
		return false;
	}
}